

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

uint to_hex(char ch)

{
  long lVar1;
  uint uVar2;
  char cVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  undefined7 in_register_00000039;
  uint *puVar7;
  long lVar8;
  char *pcVar9;
  char acStack_70 [56];
  ulong uStack_38;
  
  iVar5 = -0x30;
  if (((9 < (byte)(ch - 0x30U)) && (iVar5 = -0x57, 5 < (byte)(ch + 0x9fU))) &&
     (iVar5 = -0x37, 5 < (byte)(ch + 0xbfU))) {
    puVar7 = (uint *)0x1;
    errx(1,"character \"%c\" is not hex\n");
    switch((ulong)*puVar7) {
    case 0:
      uVar4 = puVar7[1];
      if (uVar4 == 2) {
        uVar4 = puVar7[2];
        cVar3 = 's';
        lVar8 = 0;
        do {
          lVar1 = lVar8 + 1;
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "shal"[lVar8 + 1];
          lVar8 = lVar1;
        } while (lVar1 != 4);
        fputc(0x20,(FILE *)output);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        uVar6 = CONCAT71(0x11a4,cVar3);
        uVar4 = (uint)uVar6;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          iVar5 = fputc((int)(char)uVar6,(FILE *)output);
          cVar3 = *pcVar9;
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),cVar3);
          uVar6 = (ulong)uVar4;
        }
      }
      else if (uVar4 == 1) {
        uVar4 = puVar7[2];
        cVar3 = 'd';
        lVar8 = 0;
        do {
          lVar1 = lVar8 + 1;
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "dt"[lVar8 + 1];
          lVar8 = lVar1;
        } while (lVar1 != 2);
        fputc(0x20,(FILE *)output);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        uVar6 = CONCAT71(0x11a4,cVar3);
        uVar4 = (uint)uVar6;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          iVar5 = fputc((int)(char)uVar6,(FILE *)output);
          cVar3 = *pcVar9;
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),cVar3);
          uVar6 = (ulong)uVar4;
        }
      }
      else if (uVar4 == 0) {
        uVar4 = puVar7[2];
        cVar3 = 's';
        lVar8 = 0;
        do {
          lVar1 = lVar8 + 1;
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "shll"[lVar8 + 1];
          lVar8 = lVar1;
        } while (lVar1 != 4);
        fputc(0x20,(FILE *)output);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        uVar6 = CONCAT71(0x11a4,cVar3);
        uVar4 = (uint)uVar6;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          iVar5 = fputc((int)(char)uVar6,(FILE *)output);
          cVar3 = *pcVar9;
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),cVar3);
          uVar6 = (ulong)uVar4;
        }
      }
      else {
        acStack_70[0x30] = '\0';
        acStack_70[0x31] = '\0';
        acStack_70[0x32] = '\0';
        acStack_70[0x33] = '\0';
        acStack_70[0x34] = '\0';
        acStack_70[0x35] = '\0';
        acStack_70[0x36] = '\0';
        acStack_70[0x37] = '\0';
        uStack_38 = 0;
        acStack_70[0x20] = '\0';
        acStack_70[0x21] = '\0';
        acStack_70[0x22] = '\0';
        acStack_70[0x23] = '\0';
        acStack_70[0x24] = '\0';
        acStack_70[0x25] = '\0';
        acStack_70[0x26] = '\0';
        acStack_70[0x27] = '\0';
        acStack_70[0x28] = '\0';
        acStack_70[0x29] = '\0';
        acStack_70[0x2a] = '\0';
        acStack_70[0x2b] = '\0';
        acStack_70[0x2c] = '\0';
        acStack_70[0x2d] = '\0';
        acStack_70[0x2e] = '\0';
        acStack_70[0x2f] = '\0';
        acStack_70[0x10] = '\0';
        acStack_70[0x11] = '\0';
        acStack_70[0x12] = '\0';
        acStack_70[0x13] = '\0';
        acStack_70[0x14] = '\0';
        acStack_70[0x15] = '\0';
        acStack_70[0x16] = '\0';
        acStack_70[0x17] = '\0';
        acStack_70[0x18] = '\0';
        acStack_70[0x19] = '\0';
        acStack_70[0x1a] = '\0';
        acStack_70[0x1b] = '\0';
        acStack_70[0x1c] = '\0';
        acStack_70[0x1d] = '\0';
        acStack_70[0x1e] = '\0';
        acStack_70[0x1f] = '\0';
        acStack_70[0] = '\0';
        acStack_70[1] = '\0';
        acStack_70[2] = '\0';
        acStack_70[3] = '\0';
        acStack_70[4] = '\0';
        acStack_70[5] = '\0';
        acStack_70[6] = '\0';
        acStack_70[7] = '\0';
        acStack_70[8] = '\0';
        acStack_70[9] = '\0';
        acStack_70[10] = '\0';
        acStack_70[0xb] = '\0';
        acStack_70[0xc] = '\0';
        acStack_70[0xd] = '\0';
        acStack_70[0xe] = '\0';
        acStack_70[0xf] = '\0';
        iVar5 = snprintf(acStack_70,0x40,".byte %x%x\n.byte %x%x\n",0,(ulong)uVar4,(ulong)puVar7[2],
                         puVar7[3]);
        uStack_38 = uStack_38 & 0xffffffffffffff;
        uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),acStack_70[0]);
        if (acStack_70[0] != '\0') {
          pcVar9 = acStack_70;
          do {
            pcVar9 = pcVar9 + 1;
            iVar5 = fputc((int)(char)uVar4,(FILE *)output);
            uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),*pcVar9);
          } while (*pcVar9 != '\0');
        }
      }
      break;
    case 1:
      uVar4 = puVar7[1];
      if (uVar4 == 2) {
        uVar4 = puVar7[2];
        cVar3 = 's';
        lVar8 = 0;
        do {
          lVar1 = lVar8 + 1;
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "shar"[lVar8 + 1];
          lVar8 = lVar1;
        } while (lVar1 != 4);
        fputc(0x20,(FILE *)output);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        uVar6 = CONCAT71(0x11a4,cVar3);
        uVar4 = (uint)uVar6;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          iVar5 = fputc((int)(char)uVar6,(FILE *)output);
          cVar3 = *pcVar9;
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),cVar3);
          uVar6 = (ulong)uVar4;
        }
      }
      else if (uVar4 == 1) {
        uVar4 = puVar7[2];
        cVar3 = 'c';
        lVar8 = 1;
        do {
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "cmp/pz"[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 7);
        fputc(0x20,(FILE *)output);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        uVar6 = CONCAT71(0x11a4,cVar3);
        uVar4 = (uint)uVar6;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          iVar5 = fputc((int)(char)uVar6,(FILE *)output);
          cVar3 = *pcVar9;
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),cVar3);
          uVar6 = (ulong)uVar4;
        }
      }
      else if (uVar4 == 0) {
        uVar4 = puVar7[2];
        cVar3 = 's';
        lVar8 = 0;
        do {
          lVar1 = lVar8 + 1;
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "shlr"[lVar8 + 1];
          lVar8 = lVar1;
        } while (lVar1 != 4);
        fputc(0x20,(FILE *)output);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        uVar6 = CONCAT71(0x11a4,cVar3);
        uVar4 = (uint)uVar6;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          iVar5 = fputc((int)(char)uVar6,(FILE *)output);
          cVar3 = *pcVar9;
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),cVar3);
          uVar6 = (ulong)uVar4;
        }
      }
      else {
        acStack_70[0x30] = '\0';
        acStack_70[0x31] = '\0';
        acStack_70[0x32] = '\0';
        acStack_70[0x33] = '\0';
        acStack_70[0x34] = '\0';
        acStack_70[0x35] = '\0';
        acStack_70[0x36] = '\0';
        acStack_70[0x37] = '\0';
        uStack_38 = 0;
        acStack_70[0x20] = '\0';
        acStack_70[0x21] = '\0';
        acStack_70[0x22] = '\0';
        acStack_70[0x23] = '\0';
        acStack_70[0x24] = '\0';
        acStack_70[0x25] = '\0';
        acStack_70[0x26] = '\0';
        acStack_70[0x27] = '\0';
        acStack_70[0x28] = '\0';
        acStack_70[0x29] = '\0';
        acStack_70[0x2a] = '\0';
        acStack_70[0x2b] = '\0';
        acStack_70[0x2c] = '\0';
        acStack_70[0x2d] = '\0';
        acStack_70[0x2e] = '\0';
        acStack_70[0x2f] = '\0';
        acStack_70[0x10] = '\0';
        acStack_70[0x11] = '\0';
        acStack_70[0x12] = '\0';
        acStack_70[0x13] = '\0';
        acStack_70[0x14] = '\0';
        acStack_70[0x15] = '\0';
        acStack_70[0x16] = '\0';
        acStack_70[0x17] = '\0';
        acStack_70[0x18] = '\0';
        acStack_70[0x19] = '\0';
        acStack_70[0x1a] = '\0';
        acStack_70[0x1b] = '\0';
        acStack_70[0x1c] = '\0';
        acStack_70[0x1d] = '\0';
        acStack_70[0x1e] = '\0';
        acStack_70[0x1f] = '\0';
        acStack_70[0] = '\0';
        acStack_70[1] = '\0';
        acStack_70[2] = '\0';
        acStack_70[3] = '\0';
        acStack_70[4] = '\0';
        acStack_70[5] = '\0';
        acStack_70[6] = '\0';
        acStack_70[7] = '\0';
        acStack_70[8] = '\0';
        acStack_70[9] = '\0';
        acStack_70[10] = '\0';
        acStack_70[0xb] = '\0';
        acStack_70[0xc] = '\0';
        acStack_70[0xd] = '\0';
        acStack_70[0xe] = '\0';
        acStack_70[0xf] = '\0';
        iVar5 = snprintf(acStack_70,0x40,".byte %x%x\n.byte %x%x\n",1,(ulong)uVar4,(ulong)puVar7[2],
                         puVar7[3]);
        uStack_38 = uStack_38 & 0xffffffffffffff;
        uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),acStack_70[0]);
        if (acStack_70[0] != '\0') {
          pcVar9 = acStack_70;
          do {
            pcVar9 = pcVar9 + 1;
            iVar5 = fputc((int)(char)uVar4,(FILE *)output);
            uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),*pcVar9);
          } while (*pcVar9 != '\0');
        }
      }
      break;
    case 2:
      switch((ulong)puVar7[1]) {
      case 0:
        uVar4 = puVar7[2];
        cVar3 = 's';
        lVar8 = 1;
        do {
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "sts.l mach, @-"[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0xf);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        uVar6 = CONCAT71(0x11a4,cVar3);
        uVar4 = (uint)uVar6;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          iVar5 = fputc((int)(char)uVar6,(FILE *)output);
          cVar3 = *pcVar9;
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),cVar3);
          uVar6 = (ulong)uVar4;
        }
        break;
      case 1:
        uVar4 = puVar7[2];
        cVar3 = 's';
        lVar8 = 1;
        do {
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "sts.l macl, @-"[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0xf);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        uVar6 = CONCAT71(0x11a4,cVar3);
        uVar4 = (uint)uVar6;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          iVar5 = fputc((int)(char)uVar6,(FILE *)output);
          cVar3 = *pcVar9;
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),cVar3);
          uVar6 = (ulong)uVar4;
        }
        break;
      case 2:
        uVar4 = puVar7[2];
        cVar3 = 's';
        lVar8 = 1;
        do {
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "sts.l pr, @-"[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0xd);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        uVar6 = CONCAT71(0x11a4,cVar3);
        uVar4 = (uint)uVar6;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          iVar5 = fputc((int)(char)uVar6,(FILE *)output);
          cVar3 = *pcVar9;
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),cVar3);
          uVar6 = (ulong)uVar4;
        }
        break;
      case 3:
        uVar4 = puVar7[2];
        cVar3 = 's';
        lVar8 = 1;
        do {
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "stc.l sgr, @-"[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0xe);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        uVar6 = CONCAT71(0x11a4,cVar3);
        uVar4 = (uint)uVar6;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          iVar5 = fputc((int)(char)uVar6,(FILE *)output);
          cVar3 = *pcVar9;
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),cVar3);
          uVar6 = (ulong)uVar4;
        }
        break;
      default:
        acStack_70[0x30] = '\0';
        acStack_70[0x31] = '\0';
        acStack_70[0x32] = '\0';
        acStack_70[0x33] = '\0';
        acStack_70[0x34] = '\0';
        acStack_70[0x35] = '\0';
        acStack_70[0x36] = '\0';
        acStack_70[0x37] = '\0';
        uStack_38 = 0;
        acStack_70[0x20] = '\0';
        acStack_70[0x21] = '\0';
        acStack_70[0x22] = '\0';
        acStack_70[0x23] = '\0';
        acStack_70[0x24] = '\0';
        acStack_70[0x25] = '\0';
        acStack_70[0x26] = '\0';
        acStack_70[0x27] = '\0';
        acStack_70[0x28] = '\0';
        acStack_70[0x29] = '\0';
        acStack_70[0x2a] = '\0';
        acStack_70[0x2b] = '\0';
        acStack_70[0x2c] = '\0';
        acStack_70[0x2d] = '\0';
        acStack_70[0x2e] = '\0';
        acStack_70[0x2f] = '\0';
        acStack_70[0x10] = '\0';
        acStack_70[0x11] = '\0';
        acStack_70[0x12] = '\0';
        acStack_70[0x13] = '\0';
        acStack_70[0x14] = '\0';
        acStack_70[0x15] = '\0';
        acStack_70[0x16] = '\0';
        acStack_70[0x17] = '\0';
        acStack_70[0x18] = '\0';
        acStack_70[0x19] = '\0';
        acStack_70[0x1a] = '\0';
        acStack_70[0x1b] = '\0';
        acStack_70[0x1c] = '\0';
        acStack_70[0x1d] = '\0';
        acStack_70[0x1e] = '\0';
        acStack_70[0x1f] = '\0';
        acStack_70[0] = '\0';
        acStack_70[1] = '\0';
        acStack_70[2] = '\0';
        acStack_70[3] = '\0';
        acStack_70[4] = '\0';
        acStack_70[5] = '\0';
        acStack_70[6] = '\0';
        acStack_70[7] = '\0';
        acStack_70[8] = '\0';
        acStack_70[9] = '\0';
        acStack_70[10] = '\0';
        acStack_70[0xb] = '\0';
        acStack_70[0xc] = '\0';
        acStack_70[0xd] = '\0';
        acStack_70[0xe] = '\0';
        acStack_70[0xf] = '\0';
        iVar5 = snprintf(acStack_70,0x40,".byte %x%x\n.byte %x%x\n",2,(ulong)puVar7[1],
                         (ulong)puVar7[2],puVar7[3]);
        uStack_38 = uStack_38 & 0xffffffffffffff;
        uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),acStack_70[0]);
        if (acStack_70[0] != '\0') {
          pcVar9 = acStack_70;
          do {
            pcVar9 = pcVar9 + 1;
            iVar5 = fputc((int)(char)uVar4,(FILE *)output);
            uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),*pcVar9);
          } while (*pcVar9 != '\0');
        }
        break;
      case 5:
        uVar4 = puVar7[2];
        cVar3 = 's';
        lVar8 = 1;
        do {
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "sts.l fpul, @-"[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0xf);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        uVar6 = CONCAT71(0x11a4,cVar3);
        uVar4 = (uint)uVar6;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          iVar5 = fputc((int)(char)uVar6,(FILE *)output);
          cVar3 = *pcVar9;
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),cVar3);
          uVar6 = (ulong)uVar4;
        }
        break;
      case 6:
        uVar4 = puVar7[2];
        cVar3 = 's';
        lVar8 = 1;
        do {
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "sts.l fpscr, @-"[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0x10);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        uVar6 = CONCAT71(0x11a4,cVar3);
        uVar4 = (uint)uVar6;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          iVar5 = fputc((int)(char)uVar6,(FILE *)output);
          cVar3 = *pcVar9;
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),cVar3);
          uVar6 = (ulong)uVar4;
        }
        break;
      case 0xf:
        uVar4 = puVar7[2];
        cVar3 = 's';
        lVar8 = 1;
        do {
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "stc.l dbr, @-"[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0xe);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        uVar6 = CONCAT71(0x11a4,cVar3);
        uVar4 = (uint)uVar6;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          iVar5 = fputc((int)(char)uVar6,(FILE *)output);
          cVar3 = *pcVar9;
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),cVar3);
          uVar6 = (ulong)uVar4;
        }
      }
      break;
    case 3:
      uVar4 = puVar7[1];
      switch((ulong)uVar4) {
      case 0:
        uVar4 = puVar7[2];
        cVar3 = 's';
        lVar8 = 1;
        do {
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "stc.l sr, @-"[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0xd);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        uVar6 = CONCAT71(0x11a4,cVar3);
        uVar4 = (uint)uVar6;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          iVar5 = fputc((int)(char)uVar6,(FILE *)output);
          cVar3 = *pcVar9;
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),cVar3);
          uVar6 = (ulong)uVar4;
        }
        break;
      case 1:
        uVar4 = puVar7[2];
        cVar3 = 's';
        lVar8 = 1;
        do {
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "stc.l gbr, @-"[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0xe);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        uVar6 = CONCAT71(0x11a4,cVar3);
        uVar4 = (uint)uVar6;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          iVar5 = fputc((int)(char)uVar6,(FILE *)output);
          cVar3 = *pcVar9;
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),cVar3);
          uVar6 = (ulong)uVar4;
        }
        break;
      case 2:
        uVar4 = puVar7[2];
        cVar3 = 's';
        lVar8 = 1;
        do {
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "stc.l vbr, @-"[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0xe);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        uVar6 = CONCAT71(0x11a4,cVar3);
        uVar4 = (uint)uVar6;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          iVar5 = fputc((int)(char)uVar6,(FILE *)output);
          cVar3 = *pcVar9;
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),cVar3);
          uVar6 = (ulong)uVar4;
        }
        break;
      case 3:
        uVar4 = puVar7[2];
        cVar3 = 's';
        lVar8 = 1;
        do {
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "stc.l ssr, @-"[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0xe);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        uVar6 = CONCAT71(0x11a4,cVar3);
        uVar4 = (uint)uVar6;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          iVar5 = fputc((int)(char)uVar6,(FILE *)output);
          cVar3 = *pcVar9;
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),cVar3);
          uVar6 = (ulong)uVar4;
        }
        break;
      case 4:
        uVar4 = puVar7[2];
        cVar3 = 's';
        lVar8 = 1;
        do {
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "stc.l spc, @-"[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0xe);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        uVar6 = CONCAT71(0x11a4,cVar3);
        uVar4 = (uint)uVar6;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          iVar5 = fputc((int)(char)uVar6,(FILE *)output);
          cVar3 = *pcVar9;
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),cVar3);
          uVar6 = (ulong)uVar4;
        }
        break;
      default:
        acStack_70[0x30] = '\0';
        acStack_70[0x31] = '\0';
        acStack_70[0x32] = '\0';
        acStack_70[0x33] = '\0';
        acStack_70[0x34] = '\0';
        acStack_70[0x35] = '\0';
        acStack_70[0x36] = '\0';
        acStack_70[0x37] = '\0';
        uStack_38 = 0;
        acStack_70[0x20] = '\0';
        acStack_70[0x21] = '\0';
        acStack_70[0x22] = '\0';
        acStack_70[0x23] = '\0';
        acStack_70[0x24] = '\0';
        acStack_70[0x25] = '\0';
        acStack_70[0x26] = '\0';
        acStack_70[0x27] = '\0';
        acStack_70[0x28] = '\0';
        acStack_70[0x29] = '\0';
        acStack_70[0x2a] = '\0';
        acStack_70[0x2b] = '\0';
        acStack_70[0x2c] = '\0';
        acStack_70[0x2d] = '\0';
        acStack_70[0x2e] = '\0';
        acStack_70[0x2f] = '\0';
        acStack_70[0x10] = '\0';
        acStack_70[0x11] = '\0';
        acStack_70[0x12] = '\0';
        acStack_70[0x13] = '\0';
        acStack_70[0x14] = '\0';
        acStack_70[0x15] = '\0';
        acStack_70[0x16] = '\0';
        acStack_70[0x17] = '\0';
        acStack_70[0x18] = '\0';
        acStack_70[0x19] = '\0';
        acStack_70[0x1a] = '\0';
        acStack_70[0x1b] = '\0';
        acStack_70[0x1c] = '\0';
        acStack_70[0x1d] = '\0';
        acStack_70[0x1e] = '\0';
        acStack_70[0x1f] = '\0';
        acStack_70[0] = '\0';
        acStack_70[1] = '\0';
        acStack_70[2] = '\0';
        acStack_70[3] = '\0';
        acStack_70[4] = '\0';
        acStack_70[5] = '\0';
        acStack_70[6] = '\0';
        acStack_70[7] = '\0';
        acStack_70[8] = '\0';
        acStack_70[9] = '\0';
        acStack_70[10] = '\0';
        acStack_70[0xb] = '\0';
        acStack_70[0xc] = '\0';
        acStack_70[0xd] = '\0';
        acStack_70[0xe] = '\0';
        acStack_70[0xf] = '\0';
        iVar5 = snprintf(acStack_70,0x40,".byte %x%x\n.byte %x%x\n",3,(ulong)uVar4,(ulong)puVar7[2],
                         puVar7[3]);
        uStack_38 = uStack_38 & 0xffffffffffffff;
        uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),acStack_70[0]);
        if (acStack_70[0] != '\0') {
          pcVar9 = acStack_70;
          do {
            pcVar9 = pcVar9 + 1;
            iVar5 = fputc((int)(char)uVar4,(FILE *)output);
            uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),*pcVar9);
          } while (*pcVar9 != '\0');
        }
        break;
      case 8:
      case 9:
      case 10:
      case 0xb:
      case 0xc:
      case 0xd:
      case 0xe:
      case 0xf:
        uVar2 = puVar7[2];
        cVar3 = 's';
        lVar8 = 1;
        do {
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "stc.l "[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 7);
        pcVar9 = *(char **)(sh4asm_bank_reg_str_names + (ulong)(uVar4 & 7) * 8);
        cVar3 = *pcVar9;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          fputc((int)cVar3,(FILE *)output);
          cVar3 = *pcVar9;
        }
        cVar3 = ',';
        lVar8 = 0;
        do {
          lVar1 = lVar8 + 1;
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "stc.l spc, @-"[lVar8 + 10];
          lVar8 = lVar1;
        } while (lVar1 != 4);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar2 & 0xf) * 8);
        cVar3 = *pcVar9;
        uVar6 = CONCAT71(0x11a4,cVar3);
        uVar4 = (uint)uVar6;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          iVar5 = fputc((int)(char)uVar6,(FILE *)output);
          cVar3 = *pcVar9;
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),cVar3);
          uVar6 = (ulong)uVar4;
        }
      }
      break;
    case 4:
      uVar4 = puVar7[1];
      if (uVar4 == 2) {
        uVar4 = puVar7[2];
        cVar3 = 'r';
        lVar8 = 1;
        do {
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "rotcl"[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 6);
        fputc(0x20,(FILE *)output);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        uVar6 = CONCAT71(0x11a4,cVar3);
        uVar4 = (uint)uVar6;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          iVar5 = fputc((int)(char)uVar6,(FILE *)output);
          cVar3 = *pcVar9;
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),cVar3);
          uVar6 = (ulong)uVar4;
        }
      }
      else if (uVar4 == 0) {
        uVar4 = puVar7[2];
        cVar3 = 'r';
        lVar8 = 0;
        do {
          lVar1 = lVar8 + 1;
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "rotl"[lVar8 + 1];
          lVar8 = lVar1;
        } while (lVar1 != 4);
        fputc(0x20,(FILE *)output);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        uVar6 = CONCAT71(0x11a4,cVar3);
        uVar4 = (uint)uVar6;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          iVar5 = fputc((int)(char)uVar6,(FILE *)output);
          cVar3 = *pcVar9;
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),cVar3);
          uVar6 = (ulong)uVar4;
        }
      }
      else {
        acStack_70[0x30] = '\0';
        acStack_70[0x31] = '\0';
        acStack_70[0x32] = '\0';
        acStack_70[0x33] = '\0';
        acStack_70[0x34] = '\0';
        acStack_70[0x35] = '\0';
        acStack_70[0x36] = '\0';
        acStack_70[0x37] = '\0';
        uStack_38 = 0;
        acStack_70[0x20] = '\0';
        acStack_70[0x21] = '\0';
        acStack_70[0x22] = '\0';
        acStack_70[0x23] = '\0';
        acStack_70[0x24] = '\0';
        acStack_70[0x25] = '\0';
        acStack_70[0x26] = '\0';
        acStack_70[0x27] = '\0';
        acStack_70[0x28] = '\0';
        acStack_70[0x29] = '\0';
        acStack_70[0x2a] = '\0';
        acStack_70[0x2b] = '\0';
        acStack_70[0x2c] = '\0';
        acStack_70[0x2d] = '\0';
        acStack_70[0x2e] = '\0';
        acStack_70[0x2f] = '\0';
        acStack_70[0x10] = '\0';
        acStack_70[0x11] = '\0';
        acStack_70[0x12] = '\0';
        acStack_70[0x13] = '\0';
        acStack_70[0x14] = '\0';
        acStack_70[0x15] = '\0';
        acStack_70[0x16] = '\0';
        acStack_70[0x17] = '\0';
        acStack_70[0x18] = '\0';
        acStack_70[0x19] = '\0';
        acStack_70[0x1a] = '\0';
        acStack_70[0x1b] = '\0';
        acStack_70[0x1c] = '\0';
        acStack_70[0x1d] = '\0';
        acStack_70[0x1e] = '\0';
        acStack_70[0x1f] = '\0';
        acStack_70[0] = '\0';
        acStack_70[1] = '\0';
        acStack_70[2] = '\0';
        acStack_70[3] = '\0';
        acStack_70[4] = '\0';
        acStack_70[5] = '\0';
        acStack_70[6] = '\0';
        acStack_70[7] = '\0';
        acStack_70[8] = '\0';
        acStack_70[9] = '\0';
        acStack_70[10] = '\0';
        acStack_70[0xb] = '\0';
        acStack_70[0xc] = '\0';
        acStack_70[0xd] = '\0';
        acStack_70[0xe] = '\0';
        acStack_70[0xf] = '\0';
        iVar5 = snprintf(acStack_70,0x40,".byte %x%x\n.byte %x%x\n",4,(ulong)uVar4,(ulong)puVar7[2],
                         puVar7[3]);
        uStack_38 = uStack_38 & 0xffffffffffffff;
        uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),acStack_70[0]);
        if (acStack_70[0] != '\0') {
          pcVar9 = acStack_70;
          do {
            pcVar9 = pcVar9 + 1;
            iVar5 = fputc((int)(char)uVar4,(FILE *)output);
            uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),*pcVar9);
          } while (*pcVar9 != '\0');
        }
      }
      break;
    case 5:
      uVar4 = puVar7[1];
      if (uVar4 == 2) {
        uVar4 = puVar7[2];
        cVar3 = 'r';
        lVar8 = 1;
        do {
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "rotcr"[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 6);
        fputc(0x20,(FILE *)output);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        uVar6 = CONCAT71(0x11a4,cVar3);
        uVar4 = (uint)uVar6;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          iVar5 = fputc((int)(char)uVar6,(FILE *)output);
          cVar3 = *pcVar9;
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),cVar3);
          uVar6 = (ulong)uVar4;
        }
      }
      else if (uVar4 == 1) {
        uVar4 = puVar7[2];
        cVar3 = 'c';
        lVar8 = 1;
        do {
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "cmp/pl"[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 7);
        fputc(0x20,(FILE *)output);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        uVar6 = CONCAT71(0x11a4,cVar3);
        uVar4 = (uint)uVar6;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          iVar5 = fputc((int)(char)uVar6,(FILE *)output);
          cVar3 = *pcVar9;
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),cVar3);
          uVar6 = (ulong)uVar4;
        }
      }
      else if (uVar4 == 0) {
        uVar4 = puVar7[2];
        cVar3 = 'r';
        lVar8 = 0;
        do {
          lVar1 = lVar8 + 1;
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "rotr"[lVar8 + 1];
          lVar8 = lVar1;
        } while (lVar1 != 4);
        fputc(0x20,(FILE *)output);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        uVar6 = CONCAT71(0x11a4,cVar3);
        uVar4 = (uint)uVar6;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          iVar5 = fputc((int)(char)uVar6,(FILE *)output);
          cVar3 = *pcVar9;
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),cVar3);
          uVar6 = (ulong)uVar4;
        }
      }
      else {
        acStack_70[0x30] = '\0';
        acStack_70[0x31] = '\0';
        acStack_70[0x32] = '\0';
        acStack_70[0x33] = '\0';
        acStack_70[0x34] = '\0';
        acStack_70[0x35] = '\0';
        acStack_70[0x36] = '\0';
        acStack_70[0x37] = '\0';
        uStack_38 = 0;
        acStack_70[0x20] = '\0';
        acStack_70[0x21] = '\0';
        acStack_70[0x22] = '\0';
        acStack_70[0x23] = '\0';
        acStack_70[0x24] = '\0';
        acStack_70[0x25] = '\0';
        acStack_70[0x26] = '\0';
        acStack_70[0x27] = '\0';
        acStack_70[0x28] = '\0';
        acStack_70[0x29] = '\0';
        acStack_70[0x2a] = '\0';
        acStack_70[0x2b] = '\0';
        acStack_70[0x2c] = '\0';
        acStack_70[0x2d] = '\0';
        acStack_70[0x2e] = '\0';
        acStack_70[0x2f] = '\0';
        acStack_70[0x10] = '\0';
        acStack_70[0x11] = '\0';
        acStack_70[0x12] = '\0';
        acStack_70[0x13] = '\0';
        acStack_70[0x14] = '\0';
        acStack_70[0x15] = '\0';
        acStack_70[0x16] = '\0';
        acStack_70[0x17] = '\0';
        acStack_70[0x18] = '\0';
        acStack_70[0x19] = '\0';
        acStack_70[0x1a] = '\0';
        acStack_70[0x1b] = '\0';
        acStack_70[0x1c] = '\0';
        acStack_70[0x1d] = '\0';
        acStack_70[0x1e] = '\0';
        acStack_70[0x1f] = '\0';
        acStack_70[0] = '\0';
        acStack_70[1] = '\0';
        acStack_70[2] = '\0';
        acStack_70[3] = '\0';
        acStack_70[4] = '\0';
        acStack_70[5] = '\0';
        acStack_70[6] = '\0';
        acStack_70[7] = '\0';
        acStack_70[8] = '\0';
        acStack_70[9] = '\0';
        acStack_70[10] = '\0';
        acStack_70[0xb] = '\0';
        acStack_70[0xc] = '\0';
        acStack_70[0xd] = '\0';
        acStack_70[0xe] = '\0';
        acStack_70[0xf] = '\0';
        iVar5 = snprintf(acStack_70,0x40,".byte %x%x\n.byte %x%x\n",5,(ulong)uVar4,(ulong)puVar7[2],
                         puVar7[3]);
        uStack_38 = uStack_38 & 0xffffffffffffff;
        uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),acStack_70[0]);
        if (acStack_70[0] != '\0') {
          pcVar9 = acStack_70;
          do {
            pcVar9 = pcVar9 + 1;
            iVar5 = fputc((int)(char)uVar4,(FILE *)output);
            uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),*pcVar9);
          } while (*pcVar9 != '\0');
        }
      }
      break;
    case 6:
      uVar4 = puVar7[1];
      switch((ulong)uVar4) {
      case 0:
        uVar4 = puVar7[2];
        cVar3 = 'l';
        lVar8 = 1;
        do {
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "lds.l @"[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 8);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          fputc((int)cVar3,(FILE *)output);
          cVar3 = *pcVar9;
        }
        uVar4 = 0x2b;
        lVar8 = 1;
        do {
          iVar5 = fputc((int)(char)uVar4,(FILE *)output);
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),"+, mach"[lVar8]);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 8);
        break;
      case 1:
        uVar4 = puVar7[2];
        cVar3 = 'l';
        lVar8 = 1;
        do {
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "lds.l @"[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 8);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          fputc((int)cVar3,(FILE *)output);
          cVar3 = *pcVar9;
        }
        uVar4 = 0x2b;
        lVar8 = 1;
        do {
          iVar5 = fputc((int)(char)uVar4,(FILE *)output);
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),"+, macl"[lVar8]);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 8);
        break;
      case 2:
        uVar4 = puVar7[2];
        cVar3 = 'l';
        lVar8 = 1;
        do {
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "lds.l @"[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 8);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          fputc((int)cVar3,(FILE *)output);
          cVar3 = *pcVar9;
        }
        uVar4 = 0x2b;
        lVar8 = 1;
        do {
          iVar5 = fputc((int)(char)uVar4,(FILE *)output);
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),"+, pr"[lVar8]);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 6);
        break;
      case 5:
        uVar4 = puVar7[2];
        cVar3 = 'l';
        lVar8 = 1;
        do {
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "lds.l @"[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 8);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          fputc((int)cVar3,(FILE *)output);
          cVar3 = *pcVar9;
        }
        uVar4 = 0x2b;
        lVar8 = 1;
        do {
          iVar5 = fputc((int)(char)uVar4,(FILE *)output);
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),"+, fpul"[lVar8]);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 8);
        break;
      case 6:
        uVar4 = puVar7[2];
        cVar3 = 'l';
        lVar8 = 1;
        do {
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "lds.l @"[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 8);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          fputc((int)cVar3,(FILE *)output);
          cVar3 = *pcVar9;
        }
        uVar4 = 0x2b;
        lVar8 = 0;
        do {
          lVar1 = lVar8 + 1;
          iVar5 = fputc((int)(char)uVar4,(FILE *)output);
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),"+, fpscr"[lVar8 + 1]);
          lVar8 = lVar1;
        } while (lVar1 != 8);
        break;
      default:
        if (uVar4 == 0xf) {
          uVar4 = puVar7[2];
          cVar3 = 'l';
          lVar8 = 1;
          do {
            fputc((int)cVar3,(FILE *)output);
            cVar3 = "ldc.l @"[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar8 != 8);
          pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
          cVar3 = *pcVar9;
          while (cVar3 != '\0') {
            pcVar9 = pcVar9 + 1;
            fputc((int)cVar3,(FILE *)output);
            cVar3 = *pcVar9;
          }
          uVar4 = 0x2b;
          lVar8 = 1;
          do {
            iVar5 = fputc((int)(char)uVar4,(FILE *)output);
            uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),"+, dbr"[lVar8]);
            lVar8 = lVar8 + 1;
          } while (lVar8 != 7);
          return uVar4;
        }
      case 3:
      case 4:
        acStack_70[0x30] = '\0';
        acStack_70[0x31] = '\0';
        acStack_70[0x32] = '\0';
        acStack_70[0x33] = '\0';
        acStack_70[0x34] = '\0';
        acStack_70[0x35] = '\0';
        acStack_70[0x36] = '\0';
        acStack_70[0x37] = '\0';
        uStack_38 = 0;
        acStack_70[0x20] = '\0';
        acStack_70[0x21] = '\0';
        acStack_70[0x22] = '\0';
        acStack_70[0x23] = '\0';
        acStack_70[0x24] = '\0';
        acStack_70[0x25] = '\0';
        acStack_70[0x26] = '\0';
        acStack_70[0x27] = '\0';
        acStack_70[0x28] = '\0';
        acStack_70[0x29] = '\0';
        acStack_70[0x2a] = '\0';
        acStack_70[0x2b] = '\0';
        acStack_70[0x2c] = '\0';
        acStack_70[0x2d] = '\0';
        acStack_70[0x2e] = '\0';
        acStack_70[0x2f] = '\0';
        acStack_70[0x10] = '\0';
        acStack_70[0x11] = '\0';
        acStack_70[0x12] = '\0';
        acStack_70[0x13] = '\0';
        acStack_70[0x14] = '\0';
        acStack_70[0x15] = '\0';
        acStack_70[0x16] = '\0';
        acStack_70[0x17] = '\0';
        acStack_70[0x18] = '\0';
        acStack_70[0x19] = '\0';
        acStack_70[0x1a] = '\0';
        acStack_70[0x1b] = '\0';
        acStack_70[0x1c] = '\0';
        acStack_70[0x1d] = '\0';
        acStack_70[0x1e] = '\0';
        acStack_70[0x1f] = '\0';
        acStack_70[0] = '\0';
        acStack_70[1] = '\0';
        acStack_70[2] = '\0';
        acStack_70[3] = '\0';
        acStack_70[4] = '\0';
        acStack_70[5] = '\0';
        acStack_70[6] = '\0';
        acStack_70[7] = '\0';
        acStack_70[8] = '\0';
        acStack_70[9] = '\0';
        acStack_70[10] = '\0';
        acStack_70[0xb] = '\0';
        acStack_70[0xc] = '\0';
        acStack_70[0xd] = '\0';
        acStack_70[0xe] = '\0';
        acStack_70[0xf] = '\0';
        iVar5 = snprintf(acStack_70,0x40,".byte %x%x\n.byte %x%x\n",6,(ulong)uVar4,(ulong)puVar7[2],
                         puVar7[3]);
        uStack_38 = uStack_38 & 0xffffffffffffff;
        uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),acStack_70[0]);
        if (acStack_70[0] != '\0') {
          pcVar9 = acStack_70;
          do {
            pcVar9 = pcVar9 + 1;
            iVar5 = fputc((int)(char)uVar4,(FILE *)output);
            uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),*pcVar9);
          } while (*pcVar9 != '\0');
        }
      }
      break;
    case 7:
      uVar4 = puVar7[1];
      switch((ulong)uVar4) {
      case 0:
        uVar4 = puVar7[2];
        cVar3 = 'l';
        lVar8 = 1;
        do {
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "ldc.l @"[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 8);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          fputc((int)cVar3,(FILE *)output);
          cVar3 = *pcVar9;
        }
        uVar4 = 0x2b;
        lVar8 = 1;
        do {
          iVar5 = fputc((int)(char)uVar4,(FILE *)output);
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),"+, sr"[lVar8]);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 6);
        break;
      case 1:
        uVar4 = puVar7[2];
        cVar3 = 'l';
        lVar8 = 1;
        do {
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "ldc.l @"[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 8);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          fputc((int)cVar3,(FILE *)output);
          cVar3 = *pcVar9;
        }
        uVar4 = 0x2b;
        lVar8 = 1;
        do {
          iVar5 = fputc((int)(char)uVar4,(FILE *)output);
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),"+, gbr"[lVar8]);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 7);
        break;
      case 2:
        uVar4 = puVar7[2];
        cVar3 = 'l';
        lVar8 = 1;
        do {
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "ldc.l @"[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 8);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          fputc((int)cVar3,(FILE *)output);
          cVar3 = *pcVar9;
        }
        uVar4 = 0x2b;
        lVar8 = 1;
        do {
          iVar5 = fputc((int)(char)uVar4,(FILE *)output);
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),"+, vbr"[lVar8]);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 7);
        break;
      case 3:
        uVar4 = puVar7[2];
        cVar3 = 'l';
        lVar8 = 1;
        do {
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "ldc.l @"[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 8);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          fputc((int)cVar3,(FILE *)output);
          cVar3 = *pcVar9;
        }
        uVar4 = 0x2b;
        lVar8 = 1;
        do {
          iVar5 = fputc((int)(char)uVar4,(FILE *)output);
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),"+, ssr"[lVar8]);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 7);
        break;
      case 4:
        uVar4 = puVar7[2];
        cVar3 = 'l';
        lVar8 = 1;
        do {
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "ldc.l @"[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 8);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          fputc((int)cVar3,(FILE *)output);
          cVar3 = *pcVar9;
        }
        uVar4 = 0x2b;
        lVar8 = 1;
        do {
          iVar5 = fputc((int)(char)uVar4,(FILE *)output);
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),"+, spc"[lVar8]);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 7);
        break;
      default:
        acStack_70[0x30] = '\0';
        acStack_70[0x31] = '\0';
        acStack_70[0x32] = '\0';
        acStack_70[0x33] = '\0';
        acStack_70[0x34] = '\0';
        acStack_70[0x35] = '\0';
        acStack_70[0x36] = '\0';
        acStack_70[0x37] = '\0';
        uStack_38 = 0;
        acStack_70[0x20] = '\0';
        acStack_70[0x21] = '\0';
        acStack_70[0x22] = '\0';
        acStack_70[0x23] = '\0';
        acStack_70[0x24] = '\0';
        acStack_70[0x25] = '\0';
        acStack_70[0x26] = '\0';
        acStack_70[0x27] = '\0';
        acStack_70[0x28] = '\0';
        acStack_70[0x29] = '\0';
        acStack_70[0x2a] = '\0';
        acStack_70[0x2b] = '\0';
        acStack_70[0x2c] = '\0';
        acStack_70[0x2d] = '\0';
        acStack_70[0x2e] = '\0';
        acStack_70[0x2f] = '\0';
        acStack_70[0x10] = '\0';
        acStack_70[0x11] = '\0';
        acStack_70[0x12] = '\0';
        acStack_70[0x13] = '\0';
        acStack_70[0x14] = '\0';
        acStack_70[0x15] = '\0';
        acStack_70[0x16] = '\0';
        acStack_70[0x17] = '\0';
        acStack_70[0x18] = '\0';
        acStack_70[0x19] = '\0';
        acStack_70[0x1a] = '\0';
        acStack_70[0x1b] = '\0';
        acStack_70[0x1c] = '\0';
        acStack_70[0x1d] = '\0';
        acStack_70[0x1e] = '\0';
        acStack_70[0x1f] = '\0';
        acStack_70[0] = '\0';
        acStack_70[1] = '\0';
        acStack_70[2] = '\0';
        acStack_70[3] = '\0';
        acStack_70[4] = '\0';
        acStack_70[5] = '\0';
        acStack_70[6] = '\0';
        acStack_70[7] = '\0';
        acStack_70[8] = '\0';
        acStack_70[9] = '\0';
        acStack_70[10] = '\0';
        acStack_70[0xb] = '\0';
        acStack_70[0xc] = '\0';
        acStack_70[0xd] = '\0';
        acStack_70[0xe] = '\0';
        acStack_70[0xf] = '\0';
        iVar5 = snprintf(acStack_70,0x40,".byte %x%x\n.byte %x%x\n",7,(ulong)uVar4,(ulong)puVar7[2],
                         puVar7[3]);
        uStack_38 = uStack_38 & 0xffffffffffffff;
        uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),acStack_70[0]);
        if (acStack_70[0] != '\0') {
          pcVar9 = acStack_70;
          do {
            pcVar9 = pcVar9 + 1;
            iVar5 = fputc((int)(char)uVar4,(FILE *)output);
            uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),*pcVar9);
          } while (*pcVar9 != '\0');
        }
        break;
      case 8:
      case 9:
      case 10:
      case 0xb:
      case 0xc:
      case 0xd:
      case 0xe:
      case 0xf:
        uVar2 = puVar7[2];
        cVar3 = 'l';
        lVar8 = 1;
        do {
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "ldc.l @"[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 8);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar2 & 0xf) * 8);
        cVar3 = *pcVar9;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          fputc((int)cVar3,(FILE *)output);
          cVar3 = *pcVar9;
        }
        cVar3 = '+';
        lVar8 = 1;
        do {
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "+, "[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        pcVar9 = *(char **)(sh4asm_bank_reg_str_names + (ulong)(uVar4 & 7) * 8);
        cVar3 = *pcVar9;
        uVar6 = CONCAT71(0x11a5,cVar3);
        uVar4 = (uint)uVar6;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          iVar5 = fputc((int)(char)uVar6,(FILE *)output);
          cVar3 = *pcVar9;
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),cVar3);
          uVar6 = (ulong)uVar4;
        }
      }
      break;
    case 8:
      uVar4 = puVar7[1];
      if (uVar4 == 2) {
        uVar4 = puVar7[2];
        cVar3 = 's';
        lVar8 = 1;
        do {
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "shll16"[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 7);
        fputc(0x20,(FILE *)output);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        uVar6 = CONCAT71(0x11a4,cVar3);
        uVar4 = (uint)uVar6;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          iVar5 = fputc((int)(char)uVar6,(FILE *)output);
          cVar3 = *pcVar9;
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),cVar3);
          uVar6 = (ulong)uVar4;
        }
      }
      else if (uVar4 == 1) {
        uVar4 = puVar7[2];
        cVar3 = 's';
        lVar8 = 1;
        do {
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "shll8"[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 6);
        fputc(0x20,(FILE *)output);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        uVar6 = CONCAT71(0x11a4,cVar3);
        uVar4 = (uint)uVar6;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          iVar5 = fputc((int)(char)uVar6,(FILE *)output);
          cVar3 = *pcVar9;
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),cVar3);
          uVar6 = (ulong)uVar4;
        }
      }
      else if (uVar4 == 0) {
        uVar4 = puVar7[2];
        cVar3 = 's';
        lVar8 = 1;
        do {
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "shll2"[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 6);
        fputc(0x20,(FILE *)output);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        uVar6 = CONCAT71(0x11a4,cVar3);
        uVar4 = (uint)uVar6;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          iVar5 = fputc((int)(char)uVar6,(FILE *)output);
          cVar3 = *pcVar9;
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),cVar3);
          uVar6 = (ulong)uVar4;
        }
      }
      else {
        acStack_70[0x30] = '\0';
        acStack_70[0x31] = '\0';
        acStack_70[0x32] = '\0';
        acStack_70[0x33] = '\0';
        acStack_70[0x34] = '\0';
        acStack_70[0x35] = '\0';
        acStack_70[0x36] = '\0';
        acStack_70[0x37] = '\0';
        uStack_38 = 0;
        acStack_70[0x20] = '\0';
        acStack_70[0x21] = '\0';
        acStack_70[0x22] = '\0';
        acStack_70[0x23] = '\0';
        acStack_70[0x24] = '\0';
        acStack_70[0x25] = '\0';
        acStack_70[0x26] = '\0';
        acStack_70[0x27] = '\0';
        acStack_70[0x28] = '\0';
        acStack_70[0x29] = '\0';
        acStack_70[0x2a] = '\0';
        acStack_70[0x2b] = '\0';
        acStack_70[0x2c] = '\0';
        acStack_70[0x2d] = '\0';
        acStack_70[0x2e] = '\0';
        acStack_70[0x2f] = '\0';
        acStack_70[0x10] = '\0';
        acStack_70[0x11] = '\0';
        acStack_70[0x12] = '\0';
        acStack_70[0x13] = '\0';
        acStack_70[0x14] = '\0';
        acStack_70[0x15] = '\0';
        acStack_70[0x16] = '\0';
        acStack_70[0x17] = '\0';
        acStack_70[0x18] = '\0';
        acStack_70[0x19] = '\0';
        acStack_70[0x1a] = '\0';
        acStack_70[0x1b] = '\0';
        acStack_70[0x1c] = '\0';
        acStack_70[0x1d] = '\0';
        acStack_70[0x1e] = '\0';
        acStack_70[0x1f] = '\0';
        acStack_70[0] = '\0';
        acStack_70[1] = '\0';
        acStack_70[2] = '\0';
        acStack_70[3] = '\0';
        acStack_70[4] = '\0';
        acStack_70[5] = '\0';
        acStack_70[6] = '\0';
        acStack_70[7] = '\0';
        acStack_70[8] = '\0';
        acStack_70[9] = '\0';
        acStack_70[10] = '\0';
        acStack_70[0xb] = '\0';
        acStack_70[0xc] = '\0';
        acStack_70[0xd] = '\0';
        acStack_70[0xe] = '\0';
        acStack_70[0xf] = '\0';
        iVar5 = snprintf(acStack_70,0x40,".byte %x%x\n.byte %x%x\n",8,(ulong)uVar4,(ulong)puVar7[2],
                         puVar7[3]);
        uStack_38 = uStack_38 & 0xffffffffffffff;
        uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),acStack_70[0]);
        if (acStack_70[0] != '\0') {
          pcVar9 = acStack_70;
          do {
            pcVar9 = pcVar9 + 1;
            iVar5 = fputc((int)(char)uVar4,(FILE *)output);
            uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),*pcVar9);
          } while (*pcVar9 != '\0');
        }
      }
      break;
    case 9:
      uVar4 = puVar7[1];
      if (uVar4 == 2) {
        uVar4 = puVar7[2];
        cVar3 = 's';
        lVar8 = 1;
        do {
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "shlr16"[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 7);
        fputc(0x20,(FILE *)output);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        uVar6 = CONCAT71(0x11a4,cVar3);
        uVar4 = (uint)uVar6;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          iVar5 = fputc((int)(char)uVar6,(FILE *)output);
          cVar3 = *pcVar9;
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),cVar3);
          uVar6 = (ulong)uVar4;
        }
      }
      else if (uVar4 == 1) {
        uVar4 = puVar7[2];
        cVar3 = 's';
        lVar8 = 1;
        do {
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "shlr8"[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 6);
        fputc(0x20,(FILE *)output);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        uVar6 = CONCAT71(0x11a4,cVar3);
        uVar4 = (uint)uVar6;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          iVar5 = fputc((int)(char)uVar6,(FILE *)output);
          cVar3 = *pcVar9;
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),cVar3);
          uVar6 = (ulong)uVar4;
        }
      }
      else if (uVar4 == 0) {
        uVar4 = puVar7[2];
        cVar3 = 's';
        lVar8 = 1;
        do {
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "shlr2"[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 6);
        fputc(0x20,(FILE *)output);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        uVar6 = CONCAT71(0x11a4,cVar3);
        uVar4 = (uint)uVar6;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          iVar5 = fputc((int)(char)uVar6,(FILE *)output);
          cVar3 = *pcVar9;
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),cVar3);
          uVar6 = (ulong)uVar4;
        }
      }
      else {
        acStack_70[0x30] = '\0';
        acStack_70[0x31] = '\0';
        acStack_70[0x32] = '\0';
        acStack_70[0x33] = '\0';
        acStack_70[0x34] = '\0';
        acStack_70[0x35] = '\0';
        acStack_70[0x36] = '\0';
        acStack_70[0x37] = '\0';
        uStack_38 = 0;
        acStack_70[0x20] = '\0';
        acStack_70[0x21] = '\0';
        acStack_70[0x22] = '\0';
        acStack_70[0x23] = '\0';
        acStack_70[0x24] = '\0';
        acStack_70[0x25] = '\0';
        acStack_70[0x26] = '\0';
        acStack_70[0x27] = '\0';
        acStack_70[0x28] = '\0';
        acStack_70[0x29] = '\0';
        acStack_70[0x2a] = '\0';
        acStack_70[0x2b] = '\0';
        acStack_70[0x2c] = '\0';
        acStack_70[0x2d] = '\0';
        acStack_70[0x2e] = '\0';
        acStack_70[0x2f] = '\0';
        acStack_70[0x10] = '\0';
        acStack_70[0x11] = '\0';
        acStack_70[0x12] = '\0';
        acStack_70[0x13] = '\0';
        acStack_70[0x14] = '\0';
        acStack_70[0x15] = '\0';
        acStack_70[0x16] = '\0';
        acStack_70[0x17] = '\0';
        acStack_70[0x18] = '\0';
        acStack_70[0x19] = '\0';
        acStack_70[0x1a] = '\0';
        acStack_70[0x1b] = '\0';
        acStack_70[0x1c] = '\0';
        acStack_70[0x1d] = '\0';
        acStack_70[0x1e] = '\0';
        acStack_70[0x1f] = '\0';
        acStack_70[0] = '\0';
        acStack_70[1] = '\0';
        acStack_70[2] = '\0';
        acStack_70[3] = '\0';
        acStack_70[4] = '\0';
        acStack_70[5] = '\0';
        acStack_70[6] = '\0';
        acStack_70[7] = '\0';
        acStack_70[8] = '\0';
        acStack_70[9] = '\0';
        acStack_70[10] = '\0';
        acStack_70[0xb] = '\0';
        acStack_70[0xc] = '\0';
        acStack_70[0xd] = '\0';
        acStack_70[0xe] = '\0';
        acStack_70[0xf] = '\0';
        iVar5 = snprintf(acStack_70,0x40,".byte %x%x\n.byte %x%x\n",9,(ulong)uVar4,(ulong)puVar7[2],
                         puVar7[3]);
        uStack_38 = uStack_38 & 0xffffffffffffff;
        uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),acStack_70[0]);
        if (acStack_70[0] != '\0') {
          pcVar9 = acStack_70;
          do {
            pcVar9 = pcVar9 + 1;
            iVar5 = fputc((int)(char)uVar4,(FILE *)output);
            uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),*pcVar9);
          } while (*pcVar9 != '\0');
        }
      }
      break;
    case 10:
      uVar4 = puVar7[1];
      switch((ulong)uVar4) {
      case 0:
        uVar4 = puVar7[2];
        cVar3 = 'l';
        lVar8 = 0;
        do {
          lVar1 = lVar8 + 1;
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "flds "[lVar8 + 2];
          lVar8 = lVar1;
        } while (lVar1 != 4);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          fputc((int)cVar3,(FILE *)output);
          cVar3 = *pcVar9;
        }
        uVar4 = 0x2c;
        lVar8 = 1;
        do {
          iVar5 = fputc((int)(char)uVar4,(FILE *)output);
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),"+, mach"[lVar8 + 1]);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 7);
        break;
      case 1:
        uVar4 = puVar7[2];
        cVar3 = 'l';
        lVar8 = 0;
        do {
          lVar1 = lVar8 + 1;
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "flds "[lVar8 + 2];
          lVar8 = lVar1;
        } while (lVar1 != 4);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          fputc((int)cVar3,(FILE *)output);
          cVar3 = *pcVar9;
        }
        uVar4 = 0x2c;
        lVar8 = 1;
        do {
          iVar5 = fputc((int)(char)uVar4,(FILE *)output);
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),"+, macl"[lVar8 + 1]);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 7);
        break;
      case 2:
        uVar4 = puVar7[2];
        cVar3 = 'l';
        lVar8 = 0;
        do {
          lVar1 = lVar8 + 1;
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "flds "[lVar8 + 2];
          lVar8 = lVar1;
        } while (lVar1 != 4);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          fputc((int)cVar3,(FILE *)output);
          cVar3 = *pcVar9;
        }
        uVar4 = 0x2c;
        lVar8 = 0;
        do {
          lVar1 = lVar8 + 1;
          iVar5 = fputc((int)(char)uVar4,(FILE *)output);
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),"+, pr"[lVar8 + 2]);
          lVar8 = lVar1;
        } while (lVar1 != 4);
        break;
      case 5:
        uVar4 = puVar7[2];
        cVar3 = 'l';
        lVar8 = 0;
        do {
          lVar1 = lVar8 + 1;
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "flds "[lVar8 + 2];
          lVar8 = lVar1;
        } while (lVar1 != 4);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          fputc((int)cVar3,(FILE *)output);
          cVar3 = *pcVar9;
        }
        uVar4 = 0x2c;
        lVar8 = 1;
        do {
          iVar5 = fputc((int)(char)uVar4,(FILE *)output);
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),"+, fpul"[lVar8 + 1]);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 7);
        break;
      case 6:
        uVar4 = puVar7[2];
        cVar3 = 'l';
        lVar8 = 0;
        do {
          lVar1 = lVar8 + 1;
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "flds "[lVar8 + 2];
          lVar8 = lVar1;
        } while (lVar1 != 4);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          fputc((int)cVar3,(FILE *)output);
          cVar3 = *pcVar9;
        }
        uVar4 = 0x2c;
        lVar8 = 1;
        do {
          iVar5 = fputc((int)(char)uVar4,(FILE *)output);
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),"+, fpscr"[lVar8 + 1]);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 8);
        break;
      default:
        if (uVar4 == 0xf) {
          uVar4 = puVar7[2];
          cVar3 = 'l';
          lVar8 = 0;
          do {
            lVar1 = lVar8 + 1;
            fputc((int)cVar3,(FILE *)output);
            cVar3 = "ldc "[lVar8 + 1];
            lVar8 = lVar1;
          } while (lVar1 != 4);
          pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
          cVar3 = *pcVar9;
          while (cVar3 != '\0') {
            pcVar9 = pcVar9 + 1;
            fputc((int)cVar3,(FILE *)output);
            cVar3 = *pcVar9;
          }
          uVar4 = 0x2c;
          lVar8 = 1;
          do {
            iVar5 = fputc((int)(char)uVar4,(FILE *)output);
            uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),"+, dbr"[lVar8 + 1]);
            lVar8 = lVar8 + 1;
          } while (lVar8 != 6);
          return uVar4;
        }
      case 3:
      case 4:
        acStack_70[0x30] = '\0';
        acStack_70[0x31] = '\0';
        acStack_70[0x32] = '\0';
        acStack_70[0x33] = '\0';
        acStack_70[0x34] = '\0';
        acStack_70[0x35] = '\0';
        acStack_70[0x36] = '\0';
        acStack_70[0x37] = '\0';
        uStack_38 = 0;
        acStack_70[0x20] = '\0';
        acStack_70[0x21] = '\0';
        acStack_70[0x22] = '\0';
        acStack_70[0x23] = '\0';
        acStack_70[0x24] = '\0';
        acStack_70[0x25] = '\0';
        acStack_70[0x26] = '\0';
        acStack_70[0x27] = '\0';
        acStack_70[0x28] = '\0';
        acStack_70[0x29] = '\0';
        acStack_70[0x2a] = '\0';
        acStack_70[0x2b] = '\0';
        acStack_70[0x2c] = '\0';
        acStack_70[0x2d] = '\0';
        acStack_70[0x2e] = '\0';
        acStack_70[0x2f] = '\0';
        acStack_70[0x10] = '\0';
        acStack_70[0x11] = '\0';
        acStack_70[0x12] = '\0';
        acStack_70[0x13] = '\0';
        acStack_70[0x14] = '\0';
        acStack_70[0x15] = '\0';
        acStack_70[0x16] = '\0';
        acStack_70[0x17] = '\0';
        acStack_70[0x18] = '\0';
        acStack_70[0x19] = '\0';
        acStack_70[0x1a] = '\0';
        acStack_70[0x1b] = '\0';
        acStack_70[0x1c] = '\0';
        acStack_70[0x1d] = '\0';
        acStack_70[0x1e] = '\0';
        acStack_70[0x1f] = '\0';
        acStack_70[0] = '\0';
        acStack_70[1] = '\0';
        acStack_70[2] = '\0';
        acStack_70[3] = '\0';
        acStack_70[4] = '\0';
        acStack_70[5] = '\0';
        acStack_70[6] = '\0';
        acStack_70[7] = '\0';
        acStack_70[8] = '\0';
        acStack_70[9] = '\0';
        acStack_70[10] = '\0';
        acStack_70[0xb] = '\0';
        acStack_70[0xc] = '\0';
        acStack_70[0xd] = '\0';
        acStack_70[0xe] = '\0';
        acStack_70[0xf] = '\0';
        iVar5 = snprintf(acStack_70,0x40,".byte %x%x\n.byte %x%x\n",10,(ulong)uVar4,(ulong)puVar7[2]
                         ,puVar7[3]);
        uStack_38 = uStack_38 & 0xffffffffffffff;
        uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),acStack_70[0]);
        if (acStack_70[0] != '\0') {
          pcVar9 = acStack_70;
          do {
            pcVar9 = pcVar9 + 1;
            iVar5 = fputc((int)(char)uVar4,(FILE *)output);
            uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),*pcVar9);
          } while (*pcVar9 != '\0');
        }
      }
      break;
    case 0xb:
      uVar4 = puVar7[1];
      if (uVar4 == 2) {
        uVar4 = puVar7[2];
        cVar3 = 'j';
        lVar8 = 1;
        do {
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "jmp @"[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 6);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        uVar6 = CONCAT71(0x11a4,cVar3);
        uVar4 = (uint)uVar6;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          iVar5 = fputc((int)(char)uVar6,(FILE *)output);
          cVar3 = *pcVar9;
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),cVar3);
          uVar6 = (ulong)uVar4;
        }
      }
      else if (uVar4 == 1) {
        uVar4 = puVar7[2];
        cVar3 = 't';
        lVar8 = 1;
        do {
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "tas.b @"[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 8);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        uVar6 = CONCAT71(0x11a4,cVar3);
        uVar4 = (uint)uVar6;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          iVar5 = fputc((int)(char)uVar6,(FILE *)output);
          cVar3 = *pcVar9;
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),cVar3);
          uVar6 = (ulong)uVar4;
        }
      }
      else if (uVar4 == 0) {
        uVar4 = puVar7[2];
        cVar3 = 'j';
        lVar8 = 1;
        do {
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "jsr @"[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 6);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        uVar6 = CONCAT71(0x11a4,cVar3);
        uVar4 = (uint)uVar6;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          iVar5 = fputc((int)(char)uVar6,(FILE *)output);
          cVar3 = *pcVar9;
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),cVar3);
          uVar6 = (ulong)uVar4;
        }
      }
      else {
        acStack_70[0x30] = '\0';
        acStack_70[0x31] = '\0';
        acStack_70[0x32] = '\0';
        acStack_70[0x33] = '\0';
        acStack_70[0x34] = '\0';
        acStack_70[0x35] = '\0';
        acStack_70[0x36] = '\0';
        acStack_70[0x37] = '\0';
        uStack_38 = 0;
        acStack_70[0x20] = '\0';
        acStack_70[0x21] = '\0';
        acStack_70[0x22] = '\0';
        acStack_70[0x23] = '\0';
        acStack_70[0x24] = '\0';
        acStack_70[0x25] = '\0';
        acStack_70[0x26] = '\0';
        acStack_70[0x27] = '\0';
        acStack_70[0x28] = '\0';
        acStack_70[0x29] = '\0';
        acStack_70[0x2a] = '\0';
        acStack_70[0x2b] = '\0';
        acStack_70[0x2c] = '\0';
        acStack_70[0x2d] = '\0';
        acStack_70[0x2e] = '\0';
        acStack_70[0x2f] = '\0';
        acStack_70[0x10] = '\0';
        acStack_70[0x11] = '\0';
        acStack_70[0x12] = '\0';
        acStack_70[0x13] = '\0';
        acStack_70[0x14] = '\0';
        acStack_70[0x15] = '\0';
        acStack_70[0x16] = '\0';
        acStack_70[0x17] = '\0';
        acStack_70[0x18] = '\0';
        acStack_70[0x19] = '\0';
        acStack_70[0x1a] = '\0';
        acStack_70[0x1b] = '\0';
        acStack_70[0x1c] = '\0';
        acStack_70[0x1d] = '\0';
        acStack_70[0x1e] = '\0';
        acStack_70[0x1f] = '\0';
        acStack_70[0] = '\0';
        acStack_70[1] = '\0';
        acStack_70[2] = '\0';
        acStack_70[3] = '\0';
        acStack_70[4] = '\0';
        acStack_70[5] = '\0';
        acStack_70[6] = '\0';
        acStack_70[7] = '\0';
        acStack_70[8] = '\0';
        acStack_70[9] = '\0';
        acStack_70[10] = '\0';
        acStack_70[0xb] = '\0';
        acStack_70[0xc] = '\0';
        acStack_70[0xd] = '\0';
        acStack_70[0xe] = '\0';
        acStack_70[0xf] = '\0';
        iVar5 = snprintf(acStack_70,0x40,".byte %x%x\n.byte %x%x\n",0xb,(ulong)uVar4,
                         (ulong)puVar7[2],puVar7[3]);
        uStack_38 = uStack_38 & 0xffffffffffffff;
        uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),acStack_70[0]);
        if (acStack_70[0] != '\0') {
          pcVar9 = acStack_70;
          do {
            pcVar9 = pcVar9 + 1;
            iVar5 = fputc((int)(char)uVar4,(FILE *)output);
            uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),*pcVar9);
          } while (*pcVar9 != '\0');
        }
      }
      break;
    case 0xc:
      uVar4 = puVar7[1];
      uVar2 = puVar7[2];
      cVar3 = 's';
      lVar8 = 1;
      do {
        fputc((int)cVar3,(FILE *)output);
        cVar3 = "shad "[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 6);
      pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
      cVar3 = *pcVar9;
      while (cVar3 != '\0') {
        pcVar9 = pcVar9 + 1;
        fputc((int)cVar3,(FILE *)output);
        cVar3 = *pcVar9;
      }
      cVar3 = ',';
      lVar8 = 0;
      do {
        lVar1 = lVar8 + 1;
        iVar5 = fputc((int)cVar3,(FILE *)output);
        cVar3 = ", pc), "[lVar8 + 6];
        lVar8 = lVar1;
      } while (lVar1 != 2);
      pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar2 & 0xf) * 8);
      cVar3 = *pcVar9;
      uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),cVar3);
      while (cVar3 != '\0') {
        pcVar9 = pcVar9 + 1;
        iVar5 = fputc((int)(char)uVar4,(FILE *)output);
        cVar3 = *pcVar9;
        uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),cVar3);
      }
      break;
    case 0xd:
      uVar4 = puVar7[1];
      uVar2 = puVar7[2];
      cVar3 = 's';
      lVar8 = 1;
      do {
        fputc((int)cVar3,(FILE *)output);
        cVar3 = "shld "[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 6);
      pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
      cVar3 = *pcVar9;
      while (cVar3 != '\0') {
        pcVar9 = pcVar9 + 1;
        fputc((int)cVar3,(FILE *)output);
        cVar3 = *pcVar9;
      }
      cVar3 = ',';
      lVar8 = 0;
      do {
        lVar1 = lVar8 + 1;
        iVar5 = fputc((int)cVar3,(FILE *)output);
        cVar3 = ", pc), "[lVar8 + 6];
        lVar8 = lVar1;
      } while (lVar1 != 2);
      pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar2 & 0xf) * 8);
      cVar3 = *pcVar9;
      uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),cVar3);
      while (cVar3 != '\0') {
        pcVar9 = pcVar9 + 1;
        iVar5 = fputc((int)(char)uVar4,(FILE *)output);
        cVar3 = *pcVar9;
        uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),cVar3);
      }
      break;
    case 0xe:
      uVar4 = puVar7[1];
      switch((ulong)uVar4) {
      case 0:
        uVar4 = puVar7[2];
        cVar3 = 'l';
        lVar8 = 0;
        do {
          lVar1 = lVar8 + 1;
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "ldc "[lVar8 + 1];
          lVar8 = lVar1;
        } while (lVar1 != 4);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          fputc((int)cVar3,(FILE *)output);
          cVar3 = *pcVar9;
        }
        uVar4 = 0x2c;
        lVar8 = 0;
        do {
          lVar1 = lVar8 + 1;
          iVar5 = fputc((int)(char)uVar4,(FILE *)output);
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),"+, sr"[lVar8 + 2]);
          lVar8 = lVar1;
        } while (lVar1 != 4);
        break;
      case 1:
        uVar4 = puVar7[2];
        cVar3 = 'l';
        lVar8 = 0;
        do {
          lVar1 = lVar8 + 1;
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "ldc "[lVar8 + 1];
          lVar8 = lVar1;
        } while (lVar1 != 4);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          fputc((int)cVar3,(FILE *)output);
          cVar3 = *pcVar9;
        }
        uVar4 = 0x2c;
        lVar8 = 1;
        do {
          iVar5 = fputc((int)(char)uVar4,(FILE *)output);
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),"+, gbr"[lVar8 + 1]);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 6);
        break;
      case 2:
        uVar4 = puVar7[2];
        cVar3 = 'l';
        lVar8 = 0;
        do {
          lVar1 = lVar8 + 1;
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "ldc "[lVar8 + 1];
          lVar8 = lVar1;
        } while (lVar1 != 4);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          fputc((int)cVar3,(FILE *)output);
          cVar3 = *pcVar9;
        }
        uVar4 = 0x2c;
        lVar8 = 1;
        do {
          iVar5 = fputc((int)(char)uVar4,(FILE *)output);
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),"+, vbr"[lVar8 + 1]);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 6);
        break;
      case 3:
        uVar4 = puVar7[2];
        cVar3 = 'l';
        lVar8 = 0;
        do {
          lVar1 = lVar8 + 1;
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "ldc "[lVar8 + 1];
          lVar8 = lVar1;
        } while (lVar1 != 4);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          fputc((int)cVar3,(FILE *)output);
          cVar3 = *pcVar9;
        }
        uVar4 = 0x2c;
        lVar8 = 1;
        do {
          iVar5 = fputc((int)(char)uVar4,(FILE *)output);
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),"+, ssr"[lVar8 + 1]);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 6);
        break;
      case 4:
        uVar4 = puVar7[2];
        cVar3 = 'l';
        lVar8 = 0;
        do {
          lVar1 = lVar8 + 1;
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "ldc "[lVar8 + 1];
          lVar8 = lVar1;
        } while (lVar1 != 4);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
        cVar3 = *pcVar9;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          fputc((int)cVar3,(FILE *)output);
          cVar3 = *pcVar9;
        }
        uVar4 = 0x2c;
        lVar8 = 1;
        do {
          iVar5 = fputc((int)(char)uVar4,(FILE *)output);
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),"+, spc"[lVar8 + 1]);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 6);
        break;
      default:
        acStack_70[0x30] = '\0';
        acStack_70[0x31] = '\0';
        acStack_70[0x32] = '\0';
        acStack_70[0x33] = '\0';
        acStack_70[0x34] = '\0';
        acStack_70[0x35] = '\0';
        acStack_70[0x36] = '\0';
        acStack_70[0x37] = '\0';
        uStack_38 = 0;
        acStack_70[0x20] = '\0';
        acStack_70[0x21] = '\0';
        acStack_70[0x22] = '\0';
        acStack_70[0x23] = '\0';
        acStack_70[0x24] = '\0';
        acStack_70[0x25] = '\0';
        acStack_70[0x26] = '\0';
        acStack_70[0x27] = '\0';
        acStack_70[0x28] = '\0';
        acStack_70[0x29] = '\0';
        acStack_70[0x2a] = '\0';
        acStack_70[0x2b] = '\0';
        acStack_70[0x2c] = '\0';
        acStack_70[0x2d] = '\0';
        acStack_70[0x2e] = '\0';
        acStack_70[0x2f] = '\0';
        acStack_70[0x10] = '\0';
        acStack_70[0x11] = '\0';
        acStack_70[0x12] = '\0';
        acStack_70[0x13] = '\0';
        acStack_70[0x14] = '\0';
        acStack_70[0x15] = '\0';
        acStack_70[0x16] = '\0';
        acStack_70[0x17] = '\0';
        acStack_70[0x18] = '\0';
        acStack_70[0x19] = '\0';
        acStack_70[0x1a] = '\0';
        acStack_70[0x1b] = '\0';
        acStack_70[0x1c] = '\0';
        acStack_70[0x1d] = '\0';
        acStack_70[0x1e] = '\0';
        acStack_70[0x1f] = '\0';
        acStack_70[0] = '\0';
        acStack_70[1] = '\0';
        acStack_70[2] = '\0';
        acStack_70[3] = '\0';
        acStack_70[4] = '\0';
        acStack_70[5] = '\0';
        acStack_70[6] = '\0';
        acStack_70[7] = '\0';
        acStack_70[8] = '\0';
        acStack_70[9] = '\0';
        acStack_70[10] = '\0';
        acStack_70[0xb] = '\0';
        acStack_70[0xc] = '\0';
        acStack_70[0xd] = '\0';
        acStack_70[0xe] = '\0';
        acStack_70[0xf] = '\0';
        iVar5 = snprintf(acStack_70,0x40,".byte %x%x\n.byte %x%x\n",0xe,(ulong)uVar4,
                         (ulong)puVar7[2],puVar7[3]);
        uStack_38 = uStack_38 & 0xffffffffffffff;
        uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),acStack_70[0]);
        if (acStack_70[0] != '\0') {
          pcVar9 = acStack_70;
          do {
            pcVar9 = pcVar9 + 1;
            iVar5 = fputc((int)(char)uVar4,(FILE *)output);
            uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),*pcVar9);
          } while (*pcVar9 != '\0');
        }
        break;
      case 8:
      case 9:
      case 10:
      case 0xb:
      case 0xc:
      case 0xd:
      case 0xe:
      case 0xf:
        uVar2 = puVar7[2];
        cVar3 = 'l';
        lVar8 = 0;
        do {
          lVar1 = lVar8 + 1;
          fputc((int)cVar3,(FILE *)output);
          cVar3 = "ldc "[lVar8 + 1];
          lVar8 = lVar1;
        } while (lVar1 != 4);
        pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar2 & 0xf) * 8);
        cVar3 = *pcVar9;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          fputc((int)cVar3,(FILE *)output);
          cVar3 = *pcVar9;
        }
        cVar3 = ',';
        lVar8 = 0;
        do {
          lVar1 = lVar8 + 1;
          fputc((int)cVar3,(FILE *)output);
          cVar3 = ", pc), "[lVar8 + 6];
          lVar8 = lVar1;
        } while (lVar1 != 2);
        pcVar9 = *(char **)(sh4asm_bank_reg_str_names + (ulong)(uVar4 & 7) * 8);
        cVar3 = *pcVar9;
        uVar6 = CONCAT71(0x11a5,cVar3);
        uVar4 = (uint)uVar6;
        while (cVar3 != '\0') {
          pcVar9 = pcVar9 + 1;
          iVar5 = fputc((int)(char)uVar6,(FILE *)output);
          cVar3 = *pcVar9;
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),cVar3);
          uVar6 = (ulong)uVar4;
        }
      }
      break;
    case 0xf:
      uVar4 = puVar7[1];
      uVar2 = puVar7[2];
      cVar3 = 'm';
      lVar8 = 1;
      do {
        fputc((int)cVar3,(FILE *)output);
        cVar3 = "mac.w @"[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 8);
      pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar4 & 0xf) * 8);
      cVar3 = *pcVar9;
      while (cVar3 != '\0') {
        pcVar9 = pcVar9 + 1;
        fputc((int)cVar3,(FILE *)output);
        cVar3 = *pcVar9;
      }
      cVar3 = '+';
      lVar8 = 0;
      do {
        lVar1 = lVar8 + 1;
        fputc((int)cVar3,(FILE *)output);
        cVar3 = "+, @"[lVar8 + 1];
        lVar8 = lVar1;
      } while (lVar1 != 4);
      pcVar9 = *(char **)(sh4asm_gen_reg_str_names + (ulong)(uVar2 & 0xf) * 8);
      cVar3 = *pcVar9;
      while (cVar3 != '\0') {
        pcVar9 = pcVar9 + 1;
        fputc((int)cVar3,(FILE *)output);
        cVar3 = *pcVar9;
      }
      uVar4 = fputc(0x2b,(FILE *)output);
      return uVar4;
    default:
      acStack_70[0x30] = '\0';
      acStack_70[0x31] = '\0';
      acStack_70[0x32] = '\0';
      acStack_70[0x33] = '\0';
      acStack_70[0x34] = '\0';
      acStack_70[0x35] = '\0';
      acStack_70[0x36] = '\0';
      acStack_70[0x37] = '\0';
      uStack_38 = 0;
      acStack_70[0x20] = '\0';
      acStack_70[0x21] = '\0';
      acStack_70[0x22] = '\0';
      acStack_70[0x23] = '\0';
      acStack_70[0x24] = '\0';
      acStack_70[0x25] = '\0';
      acStack_70[0x26] = '\0';
      acStack_70[0x27] = '\0';
      acStack_70[0x28] = '\0';
      acStack_70[0x29] = '\0';
      acStack_70[0x2a] = '\0';
      acStack_70[0x2b] = '\0';
      acStack_70[0x2c] = '\0';
      acStack_70[0x2d] = '\0';
      acStack_70[0x2e] = '\0';
      acStack_70[0x2f] = '\0';
      acStack_70[0x10] = '\0';
      acStack_70[0x11] = '\0';
      acStack_70[0x12] = '\0';
      acStack_70[0x13] = '\0';
      acStack_70[0x14] = '\0';
      acStack_70[0x15] = '\0';
      acStack_70[0x16] = '\0';
      acStack_70[0x17] = '\0';
      acStack_70[0x18] = '\0';
      acStack_70[0x19] = '\0';
      acStack_70[0x1a] = '\0';
      acStack_70[0x1b] = '\0';
      acStack_70[0x1c] = '\0';
      acStack_70[0x1d] = '\0';
      acStack_70[0x1e] = '\0';
      acStack_70[0x1f] = '\0';
      acStack_70[0] = '\0';
      acStack_70[1] = '\0';
      acStack_70[2] = '\0';
      acStack_70[3] = '\0';
      acStack_70[4] = '\0';
      acStack_70[5] = '\0';
      acStack_70[6] = '\0';
      acStack_70[7] = '\0';
      acStack_70[8] = '\0';
      acStack_70[9] = '\0';
      acStack_70[10] = '\0';
      acStack_70[0xb] = '\0';
      acStack_70[0xc] = '\0';
      acStack_70[0xd] = '\0';
      acStack_70[0xe] = '\0';
      acStack_70[0xf] = '\0';
      iVar5 = snprintf(acStack_70,0x40,".byte %x%x\n.byte %x%x\n",(ulong)*puVar7,(ulong)puVar7[1],
                       (ulong)puVar7[2],puVar7[3]);
      uStack_38 = uStack_38 & 0xffffffffffffff;
      uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),acStack_70[0]);
      if (acStack_70[0] != '\0') {
        pcVar9 = acStack_70;
        do {
          pcVar9 = pcVar9 + 1;
          iVar5 = fputc((int)(char)uVar4,(FILE *)output);
          uVar4 = CONCAT31((int3)((uint)iVar5 >> 8),*pcVar9);
        } while (*pcVar9 != '\0');
      }
    }
    return uVar4;
  }
  return iVar5 + (int)CONCAT71(in_register_00000039,ch);
}

Assistant:

static unsigned to_hex(char ch) {
    if (ch >= '0' && ch <= '9')
        return ch - '0';
    if (ch >= 'a' && ch <= 'f')
        return ch - 'a' + 10;
    if (ch >= 'A' && ch <= 'F')
        return ch - 'A' + 10;

    errx(1, "character \"%c\" is not hex\n", ch);
}